

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.cpp
# Opt level: O0

PyObject * pybind11_init(void)

{
  PyObject *pPVar1;
  class_<Pet> *pcVar2;
  PyObject **ppPVar3;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  init<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2d [13];
  PyObject *local_20;
  class_<Pet> local_18;
  handle local_10;
  module m;
  
  pybind11::module::module((module *)&local_10,"ctor","pybind11 constructor example");
  local_20 = local_10.m_ptr;
  pybind11::class_<Pet>::class_<>(&local_18,local_10,"Pet");
  pybind11::init<std::__cxx11::string_const&>();
  pcVar2 = pybind11::class_<Pet>::def<std::__cxx11::string_const&>(&local_18,local_2d);
  local_40 = Pet::setName;
  local_38 = 0;
  pcVar2 = pybind11::class_<Pet>::def<void(Pet::*)(std::__cxx11::string_const&)>
                     (pcVar2,"setName",(offset_in_Pet_to_subr *)&local_40);
  local_50 = Pet::getName_abi_cxx11_;
  local_48 = 0;
  pybind11::class_<Pet>::def<std::__cxx11::string_const&(Pet::*)()const>
            (pcVar2,"getName",(offset_in_Pet_to_subr *)&local_50);
  pybind11::class_<Pet>::~class_(&local_18);
  ppPVar3 = pybind11::handle::ptr(&local_10);
  pPVar1 = *ppPVar3;
  pybind11::module::~module((module *)&local_10);
  return pPVar1;
}

Assistant:

PYBIND11_PLUGIN(ctor) {
    py::module m("ctor", "pybind11 constructor example");

    py::class_<Pet>(m, "Pet")
        .def(py::init<const std::string &>())
        .def("setName", &Pet::setName)
        .def("getName", &Pet::getName);

    return m.ptr();
}